

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

Capability __thiscall spvtools::EnumSet<spv::Capability>::Iterator::operator*(Iterator *this)

{
  bool bVar1;
  Capability CVar2;
  const_reference bucket;
  Iterator *this_local;
  
  bVar1 = HasEnumAt(this->set_,this->bucketIndex_,(ulong)this->bucketOffset_);
  if (!bVar1) {
    __assert_fail("set_->HasEnumAt(bucketIndex_, bucketOffset_) && \"operator*() called on an invalid iterator.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x7f,
                  "T spvtools::EnumSet<spv::Capability>::Iterator::operator*() const [T = spv::Capability]"
                 );
  }
  bucket = std::
           vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ::operator[](&this->set_->buckets_,this->bucketIndex_);
  CVar2 = GetValueFromBucket(bucket,(ulong)this->bucketOffset_);
  return CVar2;
}

Assistant:

T operator*() const {
      assert(set_->HasEnumAt(bucketIndex_, bucketOffset_) &&
             "operator*() called on an invalid iterator.");
      return GetValueFromBucket(set_->buckets_[bucketIndex_], bucketOffset_);
    }